

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

crypto_word_t constant_time_select_w(crypto_word_t mask,crypto_word_t a,crypto_word_t b)

{
  crypto_word_t cVar1;
  crypto_word_t b_local;
  crypto_word_t a_local;
  crypto_word_t mask_local;
  
  cVar1 = value_barrier_w(mask);
  return cVar1 & a | (cVar1 ^ 0xffffffffffffffff) & b;
}

Assistant:

static inline crypto_word_t constant_time_select_w(crypto_word_t mask,
                                                   crypto_word_t a,
                                                   crypto_word_t b) {
  // Clang recognizes this pattern as a select. While it usually transforms it
  // to a cmov, it sometimes further transforms it into a branch, which we do
  // not want.
  //
  // Hiding the value of the mask from the compiler evades this transformation.
  mask = value_barrier_w(mask);
  return (mask & a) | (~mask & b);
}